

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::
BasicResult<Catch::clara::detail::ParseResultType>
          (BasicResult<Catch::clara::detail::ParseState> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *other)

{
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type =
       (other->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
  ;
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_0017d8d0;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)&other->m_errorMessage);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("type() != ResultBase::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tomjnixon[P]actorpp/submodules/catch2/catch.hpp"
                ,0x232d,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::clara::detail::ParseState, U = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }